

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCastToBlob::Operation<duckdb::string_t,duckdb::string_t>
          (TryCastToBlob *this,string_t input,string_t *result,Vector *result_vector,
          CastParameters *parameters)

{
  bool bVar1;
  ulong uVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  idx_t len;
  char *pcVar4;
  anon_struct_16_3_d7536bce_for_pointer aVar5;
  string_t str;
  string_t str_00;
  idx_t result_size;
  Vector *local_30;
  
  paVar3 = input.value._8_8_;
  str.value._0_8_ = input.value._0_8_;
  str.value.pointer.ptr = (char *)&local_30;
  bVar1 = Blob::TryGetBlobSize
                    ((Blob *)this,str,(idx_t *)result_vector,(CastParameters *)result_vector);
  if (bVar1) {
    aVar5 = (anon_struct_16_3_d7536bce_for_pointer)
            StringVector::EmptyString((StringVector *)result,local_30,len);
    paVar3->pointer = aVar5;
    pcVar4 = aVar5.ptr;
    if (aVar5.length < 0xd) {
      pcVar4 = (paVar3->pointer).prefix;
    }
    str_00.value.pointer.ptr = pcVar4;
    str_00.value._0_8_ = str.value._0_8_;
    Blob::ToBlob((Blob *)this,str_00,&result_vector->vector_type);
    uVar2 = (ulong)(paVar3->pointer).length;
    if (uVar2 < 0xd) {
      switchD_012e3010::default((paVar3->pointer).prefix + uVar2,0,0xc - uVar2);
    }
    else {
      *(undefined4 *)(paVar3->pointer).prefix = *(undefined4 *)(paVar3->pointer).ptr;
    }
  }
  return bVar1;
}

Assistant:

bool TryCastToBlob::Operation(string_t input, string_t &result, Vector &result_vector, CastParameters &parameters) {
	idx_t result_size;
	if (!Blob::TryGetBlobSize(input, result_size, parameters)) {
		return false;
	}

	result = StringVector::EmptyString(result_vector, result_size);
	Blob::ToBlob(input, data_ptr_cast(result.GetDataWriteable()));
	result.Finalize();
	return true;
}